

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeSorterInit(sqlite3 *db,int nField,VdbeCursor *pCsr)

{
  int *piVar1;
  u32 uVar2;
  Btree *p;
  char cVar3;
  VdbeSorter *pVVar4;
  u8 *puVar5;
  int iVar6;
  byte bVar7;
  u32 uVar8;
  ulong uVar9;
  KeyInfo *__dest;
  long lVar10;
  
  iVar6 = 0;
  if ((db->temp_store != '\x02') && (iVar6 = 0, sqlite3Config.bCoreMutex != '\0')) {
    iVar6 = db->aLimit[0xb];
  }
  uVar9 = (ulong)pCsr->pKeyInfo->nKeyField;
  lVar10 = (long)(iVar6 * 0x68 + 200);
  pVVar4 = (VdbeSorter *)sqlite3DbMallocZero(db,lVar10 + uVar9 * 8 + 0x20);
  (pCsr->uc).pSorter = pVVar4;
  if (pVVar4 == (VdbeSorter *)0x0) {
    iVar6 = 7;
  }
  else {
    p = db->aDb->pBt;
    __dest = (KeyInfo *)((long)pVVar4->aTask + lVar10 + -0x60);
    pVVar4->pKeyInfo = __dest;
    memcpy(__dest,pCsr->pKeyInfo,uVar9 * 8 + 0x20);
    *(undefined8 *)((long)pVVar4->aTask + lVar10 + -0x50) = 0;
    if (iVar6 == 0 && nField != 0) {
      __dest->nKeyField = (u16)nField;
    }
    if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
      btreeLockCarefully(p);
    }
    uVar2 = p->pBt->pageSize;
    pVVar4->pgsz = uVar2;
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
      }
    }
    cVar3 = (char)iVar6;
    pVVar4->bUseThreads = 1 < (byte)(cVar3 + 1U);
    bVar7 = cVar3 + 1;
    pVVar4->nTask = bVar7;
    pVVar4->iPrev = cVar3 + 0xff;
    pVVar4->db = db;
    if (bVar7 != 0) {
      lVar10 = 0;
      do {
        *(VdbeSorter **)((long)&pVVar4->aTask[0].pSorter + lVar10) = pVVar4;
        lVar10 = lVar10 + 0x68;
      } while ((ulong)bVar7 * 0x68 - lVar10 != 0);
    }
    iVar6 = 0;
    if (db->temp_store != '\x02') {
      iVar6 = sqlite3Config.szPma * uVar2;
      pVVar4->mnPmaSize = iVar6;
      lVar10 = (long)db->aDb->pSchema->cache_size;
      uVar8 = 0xfffffc00;
      if (-1 < lVar10) {
        uVar8 = uVar2;
      }
      lVar10 = (int)uVar8 * lVar10;
      if (0x1fffffff < lVar10) {
        lVar10 = 0x20000000;
      }
      if (iVar6 <= (int)lVar10) {
        iVar6 = (int)lVar10;
      }
      pVVar4->mxPmaSize = iVar6;
      iVar6 = 0;
      if (sqlite3Config.bSmallMalloc == '\0') {
        pVVar4->nMemory = uVar2;
        puVar5 = (u8 *)sqlite3Malloc((long)(int)uVar2);
        (pVVar4->list).aMemory = puVar5;
        iVar6 = 7;
        if (puVar5 != (u8 *)0x0) {
          iVar6 = 0;
        }
      }
    }
    if ((__dest->nAllField < 0xd) &&
       (((__dest->aColl[0] == (CollSeq *)0x0 || (__dest->aColl[0] == db->pDfltColl)) &&
        ((*__dest->aSortFlags & 2) == 0)))) {
      pVVar4->typeMask = '\x03';
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterInit(
  sqlite3 *db,                    /* Database connection (for malloc()) */
  int nField,                     /* Number of key fields in each record */
  VdbeCursor *pCsr                /* Cursor that holds the new sorter */
){
  int pgsz;                       /* Page size of main database */
  int i;                          /* Used to iterate through aTask[] */
  VdbeSorter *pSorter;            /* The new sorter */
  KeyInfo *pKeyInfo;              /* Copy of pCsr->pKeyInfo with db==0 */
  int szKeyInfo;                  /* Size of pCsr->pKeyInfo in bytes */
  int sz;                         /* Size of pSorter in bytes */
  int rc = SQLITE_OK;
#if SQLITE_MAX_WORKER_THREADS==0
# define nWorker 0
#else
  int nWorker;
#endif

  /* Initialize the upper limit on the number of worker threads */
#if SQLITE_MAX_WORKER_THREADS>0
  if( sqlite3TempInMemory(db) || sqlite3GlobalConfig.bCoreMutex==0 ){
    nWorker = 0;
  }else{
    nWorker = db->aLimit[SQLITE_LIMIT_WORKER_THREADS];
  }
#endif

  /* Do not allow the total number of threads (main thread + all workers)
  ** to exceed the maximum merge count */
#if SQLITE_MAX_WORKER_THREADS>=SORTER_MAX_MERGE_COUNT
  if( nWorker>=SORTER_MAX_MERGE_COUNT ){
    nWorker = SORTER_MAX_MERGE_COUNT-1;
  }
#endif

  assert( pCsr->pKeyInfo );
  assert( !pCsr->isEphemeral );
  assert( pCsr->eCurType==CURTYPE_SORTER );
  szKeyInfo = sizeof(KeyInfo) + (pCsr->pKeyInfo->nKeyField-1)*sizeof(CollSeq*);
  sz = sizeof(VdbeSorter) + nWorker * sizeof(SortSubtask);

  pSorter = (VdbeSorter*)sqlite3DbMallocZero(db, sz + szKeyInfo);
  pCsr->uc.pSorter = pSorter;
  if( pSorter==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }else{
    Btree *pBt = db->aDb[0].pBt;
    pSorter->pKeyInfo = pKeyInfo = (KeyInfo*)((u8*)pSorter + sz);
    memcpy(pKeyInfo, pCsr->pKeyInfo, szKeyInfo);
    pKeyInfo->db = 0;
    if( nField && nWorker==0 ){
      pKeyInfo->nKeyField = nField;
    }
    sqlite3BtreeEnter(pBt);
    pSorter->pgsz = pgsz = sqlite3BtreeGetPageSize(pBt);
    sqlite3BtreeLeave(pBt);
    pSorter->nTask = nWorker + 1;
    pSorter->iPrev = (u8)(nWorker - 1);
    pSorter->bUseThreads = (pSorter->nTask>1);
    pSorter->db = db;
    for(i=0; i<pSorter->nTask; i++){
      SortSubtask *pTask = &pSorter->aTask[i];
      pTask->pSorter = pSorter;
    }

    if( !sqlite3TempInMemory(db) ){
      i64 mxCache;                /* Cache size in bytes*/
      u32 szPma = sqlite3GlobalConfig.szPma;
      pSorter->mnPmaSize = szPma * pgsz;

      mxCache = db->aDb[0].pSchema->cache_size;
      if( mxCache<0 ){
        /* A negative cache-size value C indicates that the cache is abs(C)
        ** KiB in size.  */
        mxCache = mxCache * -1024;
      }else{
        mxCache = mxCache * pgsz;
      }
      mxCache = MIN(mxCache, SQLITE_MAX_PMASZ);
      pSorter->mxPmaSize = MAX(pSorter->mnPmaSize, (int)mxCache);

      /* Avoid large memory allocations if the application has requested
      ** SQLITE_CONFIG_SMALL_MALLOC. */
      if( sqlite3GlobalConfig.bSmallMalloc==0 ){
        assert( pSorter->iMemory==0 );
        pSorter->nMemory = pgsz;
        pSorter->list.aMemory = (u8*)sqlite3Malloc(pgsz);
        if( !pSorter->list.aMemory ) rc = SQLITE_NOMEM_BKPT;
      }
    }

    if( pKeyInfo->nAllField<13
     && (pKeyInfo->aColl[0]==0 || pKeyInfo->aColl[0]==db->pDfltColl)
     && (pKeyInfo->aSortFlags[0] & KEYINFO_ORDER_BIGNULL)==0
    ){
      pSorter->typeMask = SORTER_TYPE_INTEGER | SORTER_TYPE_TEXT;
    }
  }

  return rc;
}